

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

el_action_t ed_search_next_history(EditLine *el,wint_t c)

{
  void *pvVar1;
  wchar_t *__s2;
  el_action_t eVar2;
  wchar_t wVar3;
  int iVar4;
  wchar_t wVar5;
  size_t __n;
  wchar_t wVar6;
  wchar_t *__s1;
  
  (el->el_chared).c_vcmd.action = L'\0';
  (el->el_chared).c_undo.len = -1;
  *(el->el_line).lastchar = L'\0';
  if (((el->el_history).eventno != L'\0') && (pvVar1 = (el->el_history).ref, pvVar1 != (void *)0x0))
  {
    if ((el->el_flags & L'@') == L'\0') {
      __s1 = (wchar_t *)0x0;
      wVar3 = (*(el->el_history).fun)(pvVar1,&(el->el_history).ev,L'\x03',0);
      if (wVar3 != L'\xffffffff') {
        __s1 = (el->el_history).ev.str;
      }
    }
    else {
      __s1 = hist_convert(el,L'\x03',(void *)0x0);
    }
    if (__s1 != (wchar_t *)0x0) {
      c_setpat(el);
      wVar3 = L'\0';
      if (L'\x01' < (el->el_history).eventno) {
        wVar6 = L'\x02';
        wVar3 = L'\0';
        do {
          __s2 = (el->el_line).buffer;
          __n = (long)(el->el_line).lastchar - (long)__s2 >> 2;
          iVar4 = wcsncmp(__s1,__s2,__n);
          if ((iVar4 != 0) || (__s1[__n] != L'\0')) {
            wVar5 = c_hmatch(el,__s1);
            if (wVar5 != L'\0') {
              wVar3 = wVar6 + L'\xffffffff';
            }
          }
          if ((el->el_flags & L'@') == L'\0') {
            wVar5 = (*(el->el_history).fun)((el->el_history).ref,&(el->el_history).ev,L'\x06',0);
            __s1 = (wchar_t *)0x0;
            if (wVar5 != L'\xffffffff') {
              __s1 = (el->el_history).ev.str;
            }
          }
          else {
            __s1 = hist_convert(el,L'\x06',(void *)0x0);
          }
        } while ((wVar6 < (el->el_history).eventno) &&
                (wVar6 = wVar6 + L'\x01', __s1 != (wchar_t *)0x0));
      }
      if ((wVar3 == L'\0') && (wVar6 = c_hmatch(el,(el->el_history).buf), wVar6 == L'\0')) {
        return '\x06';
      }
      (el->el_history).eventno = wVar3;
      eVar2 = hist_get(el);
      return eVar2;
    }
  }
  return '\x06';
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
ed_search_next_history(EditLine *el, wint_t c __attribute__((__unused__)))
{
	const wchar_t *hp;
	int h;
	int found = 0;

	el->el_chared.c_vcmd.action = NOP;
	el->el_chared.c_undo.len = -1;
	*el->el_line.lastchar = '\0';	/* just in case */

	if (el->el_history.eventno == 0)
		return CC_ERROR;

	if (el->el_history.ref == NULL)
		return CC_ERROR;

	hp = HIST_FIRST(el);
	if (hp == NULL)
		return CC_ERROR;

	c_setpat(el);		/* Set search pattern !! */

	for (h = 1; h < el->el_history.eventno && hp; h++) {
#ifdef SDEBUG
		(void) fprintf(el->el_errfile, "Comparing with \"%ls\"\n", hp);
#endif
		if ((wcsncmp(hp, el->el_line.buffer, (size_t)
			    (el->el_line.lastchar - el->el_line.buffer)) ||
			hp[el->el_line.lastchar - el->el_line.buffer]) &&
		    c_hmatch(el, hp))
			found = h;
		hp = HIST_NEXT(el);
	}

	if (!found) {		/* is it the current history number? */
		if (!c_hmatch(el, el->el_history.buf)) {
#ifdef SDEBUG
			(void) fprintf(el->el_errfile, "not found\n");
#endif
			return CC_ERROR;
		}
	}
	el->el_history.eventno = found;

	return hist_get(el);
}